

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O3

void __thiscall
miniros::ServiceClient::ServiceClient
          (ServiceClient *this,string *service_name,bool persistent,M_string *header_values,
          string *service_md5sum)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Impl *this_01;
  ServiceManagerPtr *pSVar4;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  this_01 = (Impl *)operator_new(0x90);
  Impl::Impl(this_01);
  (this->impl_).super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this_01;
  local_38 = &(this->impl_).
              super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<miniros::ServiceClient::Impl*>
            (local_38,this_01);
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->impl_).
               super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->name_);
  peVar1 = (this->impl_).
           super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->persistent_ = persistent;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&(peVar1->header_values_)._M_t,&header_values->_M_t);
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->impl_).
               super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->service_md5sum_);
  if (persistent) {
    pSVar4 = ServiceManager::instance();
    peVar1 = (this->impl_).
             super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ServiceManager::createServiceServerLink
              ((ServiceManager *)&stack0xffffffffffffffb8,
               (string *)
               (pSVar4->super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,(bool)((char)peVar1 + '\x10'),(string *)(ulong)peVar1->persistent_,
               &peVar1->service_md5sum_,(M_string *)&peVar1->service_md5sum_);
    p_Var3 = p_Stack_40;
    peVar2 = local_48;
    peVar1 = (this->impl_).
             super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48 = (element_type *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (peVar1->server_link_).
              super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
    (peVar1->server_link_).
    super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (peVar1->server_link_).
    super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
  }
  return;
}

Assistant:

ServiceClient::ServiceClient(const std::string& service_name, bool persistent, const M_string& header_values, const std::string& service_md5sum)
: impl_(new Impl)
{
  impl_->name_ = service_name;
  impl_->persistent_ = persistent;
  impl_->header_values_ = header_values;
  impl_->service_md5sum_ = service_md5sum;

  if (persistent)
  {
    impl_->server_link_ = ServiceManager::instance()->createServiceServerLink(impl_->name_, impl_->persistent_, impl_->service_md5sum_, impl_->service_md5sum_, impl_->header_values_);
  }
}